

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

char * CalcWordWrapNextLineStartA(char *text,char *text_end)

{
  char *in_RSI;
  char *in_RDI;
  bool local_11;
  char *local_8;
  
  local_8 = in_RDI;
  while( true ) {
    local_11 = false;
    if (local_8 < in_RSI) {
      local_11 = ImCharIsBlankA(*local_8);
    }
    if (local_11 == false) break;
    local_8 = local_8 + 1;
  }
  if (*local_8 == '\n') {
    local_8 = local_8 + 1;
  }
  return local_8;
}

Assistant:

static inline const char* CalcWordWrapNextLineStartA(const char* text, const char* text_end)
{
    while (text < text_end && ImCharIsBlankA(*text))
        text++;
    if (*text == '\n')
        text++;
    return text;
}